

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::SliceLayerParams::_InternalSerialize
          (SliceLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  void *data;
  bool bVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  int size;
  ulong uVar7;
  size_t __n;
  
  uVar5 = this->startindex_;
  if (uVar5 != 0) {
    puVar2 = target;
    if (stream->end_ <= target) {
      puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      uVar5 = this->startindex_;
    }
    *puVar2 = '\b';
    puVar2[1] = (byte)uVar5;
    if (uVar5 < 0x80) {
      target = puVar2 + 2;
    }
    else {
      puVar2[1] = (byte)uVar5 | 0x80;
      puVar2[2] = (uint8_t)(uVar5 >> 7);
      target = puVar2 + 3;
      if (0x3fff < uVar5) {
        uVar7 = (ulong)puVar2[2];
        uVar5 = uVar5 >> 7;
        do {
          target[-1] = (byte)uVar7 | 0x80;
          uVar4 = uVar5 >> 7;
          *target = (uint8_t)uVar4;
          target = target + 1;
          uVar7 = uVar4 & 0xffffffff;
          bVar1 = 0x3fff < uVar5;
          uVar5 = uVar4;
        } while (bVar1);
      }
    }
  }
  uVar5 = this->endindex_;
  puVar2 = target;
  if (uVar5 != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      uVar5 = this->endindex_;
    }
    *target = '\x10';
    target[1] = (byte)uVar5;
    if (uVar5 < 0x80) {
      puVar2 = target + 2;
    }
    else {
      target[1] = (byte)uVar5 | 0x80;
      target[2] = (uint8_t)(uVar5 >> 7);
      puVar2 = target + 3;
      if (0x3fff < uVar5) {
        uVar7 = (ulong)target[2];
        uVar5 = uVar5 >> 7;
        do {
          puVar2[-1] = (byte)uVar7 | 0x80;
          uVar4 = uVar5 >> 7;
          *puVar2 = (uint8_t)uVar4;
          puVar2 = puVar2 + 1;
          uVar7 = uVar4 & 0xffffffff;
          bVar1 = 0x3fff < uVar5;
          uVar5 = uVar4;
        } while (bVar1);
      }
    }
  }
  uVar5 = this->stride_;
  if (uVar5 != 0) {
    puVar3 = puVar2;
    if (stream->end_ <= puVar2) {
      puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar2);
      uVar5 = this->stride_;
    }
    *puVar3 = '\x18';
    puVar3[1] = (byte)uVar5;
    if (uVar5 < 0x80) {
      puVar2 = puVar3 + 2;
    }
    else {
      puVar3[1] = (byte)uVar5 | 0x80;
      puVar3[2] = (uint8_t)(uVar5 >> 7);
      puVar2 = puVar3 + 3;
      if (0x3fff < uVar5) {
        uVar7 = (ulong)puVar3[2];
        uVar5 = uVar5 >> 7;
        do {
          puVar2[-1] = (byte)uVar7 | 0x80;
          uVar4 = uVar5 >> 7;
          *puVar2 = (uint8_t)uVar4;
          puVar2 = puVar2 + 1;
          uVar7 = uVar4 & 0xffffffff;
          bVar1 = 0x3fff < uVar5;
          uVar5 = uVar4;
        } while (bVar1);
      }
    }
  }
  uVar6 = this->axis_;
  puVar3 = puVar2;
  if (uVar6 != 0) {
    if (stream->end_ <= puVar2) {
      puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar2);
      uVar6 = this->axis_;
    }
    *puVar2 = ' ';
    puVar2[1] = (byte)uVar6;
    if (uVar6 < 0x80) {
      puVar3 = puVar2 + 2;
    }
    else {
      puVar2[1] = (byte)uVar6 | 0x80;
      puVar2[2] = (uint8_t)((ulong)(long)(int)uVar6 >> 7);
      puVar3 = puVar2 + 3;
      if (0x3fff < uVar6) {
        uVar7 = (ulong)puVar2[2];
        uVar5 = (ulong)(long)(int)uVar6 >> 7;
        do {
          puVar3[-1] = (byte)uVar7 | 0x80;
          uVar4 = uVar5 >> 7;
          *puVar3 = (uint8_t)uVar4;
          puVar3 = puVar3 + 1;
          uVar7 = uVar4 & 0xffffffff;
          bVar1 = 0x3fff < uVar5;
          uVar5 = uVar4;
        } while (bVar1);
      }
    }
  }
  uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar5 & 1) != 0) {
    uVar5 = uVar5 & 0xfffffffffffffffc;
    data = *(void **)(uVar5 + 8);
    size = (int)*(undefined8 *)(uVar5 + 0x10);
    __n = (size_t)size;
    if ((long)stream->end_ - (long)puVar3 < (long)__n) {
      puVar2 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,puVar3);
      return puVar2;
    }
    memcpy(puVar3,data,__n);
    puVar3 = puVar3 + __n;
  }
  return puVar3;
}

Assistant:

uint8_t* SliceLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.SliceLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 startIndex = 1;
  if (this->_internal_startindex() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(1, this->_internal_startindex(), target);
  }

  // int64 endIndex = 2;
  if (this->_internal_endindex() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(2, this->_internal_endindex(), target);
  }

  // uint64 stride = 3;
  if (this->_internal_stride() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(3, this->_internal_stride(), target);
  }

  // .CoreML.Specification.SliceLayerParams.SliceAxis axis = 4;
  if (this->_internal_axis() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      4, this->_internal_axis(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.SliceLayerParams)
  return target;
}